

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2ProcessingInstruction(void *ctx,xmlChar *target,xmlChar *data)

{
  xmlNodePtr node;
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *data_local;
  xmlChar *target_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    node = xmlNewDocPI(*(xmlDocPtr *)((long)ctx + 0x10),target,data);
    if (node == (xmlNodePtr)0x0) {
      xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx);
    }
    else {
      xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,node);
    }
  }
  return;
}

Assistant:

void
xmlSAX2ProcessingInstruction(void *ctx, const xmlChar *target,
                      const xmlChar *data)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;

    ret = xmlNewDocPI(ctxt->myDoc, target, data);
    if (ret == NULL) {
        xmlSAX2ErrMemory(ctxt);
        return;
    }

    xmlSAX2AppendChild(ctxt, ret);
}